

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void calc_sad_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,int cand_start,
               int *cost_list)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  buf_2d *pbVar3;
  uint uVar4;
  FULLPEL_MV FVar5;
  short sVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  ushort uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  short sVar14;
  ushort uVar15;
  long lVar16;
  
  if (cand_start < num_candidates) {
    lVar11 = (long)search_step;
    pbVar1 = (ms_params->ms_buffers).src;
    psVar2 = ms_params->search_sites;
    pbVar3 = (ms_params->ms_buffers).ref;
    lVar13 = (long)cand_start;
    lVar16 = 0;
    do {
      sVar8 = psVar2->site[lVar11][lVar13 + lVar16].mv.col + center_mv.col;
      if (((ms_params->mv_limits).col_min <= (int)sVar8) &&
         ((int)sVar8 <= (ms_params->mv_limits).col_max)) {
        sVar9 = psVar2->site[lVar11][lVar13 + lVar16].mv.row + center_mv.row;
        if (((ms_params->mv_limits).row_min <= (int)sVar9) &&
           ((int)sVar9 <= (ms_params->mv_limits).row_max)) {
          uVar4 = (*ms_params->sdf)(pbVar1->buf,pbVar1->stride,
                                    center_address + psVar2->site[lVar11][lVar13 + lVar16].offset,
                                    pbVar3->stride);
          if (cost_list != (int *)0x0) {
            cost_list[lVar13 + lVar16 + 1] = uVar4;
          }
          if (uVar4 < *bestsad) {
            if (mv_cost_params->mv_cost_type < 4) {
              sVar14 = sVar9 - (mv_cost_params->full_ref_mv).row;
              uVar15 = sVar14 * 8;
              sVar6 = sVar8 - (mv_cost_params->full_ref_mv).col;
              uVar7 = sVar6 * 8;
              switch(mv_cost_params->mv_cost_type) {
              case '\0':
                uVar12 = (mv_cost_params->mvcost[0][(short)uVar15] +
                          *(int *)((long)mv_cost_params->mvjcost +
                                  (ulong)((uint)(uVar7 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                         mv_cost_params->mvcost[1][(short)uVar7]) * mv_cost_params->sad_per_bit +
                         0x100U >> 9;
                break;
              case '\x01':
                uVar10 = sVar14 * -8;
                if ((short)(sVar14 * -8) < 0) {
                  uVar10 = uVar15;
                }
                uVar15 = sVar6 * -8;
                if ((short)(sVar6 * -8) < 0) {
                  uVar15 = uVar7;
                }
                uVar12 = ((uint)uVar15 + (uint)uVar10) * 4;
                break;
              case '\x02':
                uVar10 = sVar14 * -8;
                if ((short)(sVar14 * -8) < 0) {
                  uVar10 = uVar15;
                }
                uVar15 = sVar6 * -8;
                if ((short)(sVar6 * -8) < 0) {
                  uVar15 = uVar7;
                }
                uVar12 = ((uint)uVar15 + (uint)uVar10) * 0xf >> 3;
                break;
              case '\x03':
                uVar10 = sVar14 * -8;
                if ((short)(sVar14 * -8) < 0) {
                  uVar10 = uVar15;
                }
                uVar15 = sVar6 * -8;
                if ((short)(sVar6 * -8) < 0) {
                  uVar15 = uVar7;
                }
                uVar12 = (uint)uVar15 + (uint)uVar10;
              }
            }
            else {
              uVar12 = 0;
            }
            if (uVar12 + uVar4 < *bestsad) {
              if (raw_bestsad != (uint *)0x0) {
                *raw_bestsad = uVar4;
              }
              FVar5.col = sVar8;
              FVar5.row = sVar9;
              *bestsad = uVar12 + uVar4;
              *best_mv = FVar5;
              *best_site = cand_start + (int)lVar16;
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while ((cand_start - num_candidates) + (int)lVar16 != 0);
  }
  return;
}

Assistant:

static inline void calc_sad_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = cand_start; i < num_candidates; i++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[i].mv.row,
                                 center_mv.col + site[i].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) continue;
    int thissad = get_mvpred_sad(ms_params, src,
                                 center_address + site[i].offset, ref->stride);
    if (cost_list) {
      cost_list[i + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}